

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void __thiscall kratos::FSMState::FSMState(FSMState *this,string *name,FSM *parent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  
  (this->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
  super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
  super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar5;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar4;
    (this->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this->parent_ = parent;
  (this->transitions_).
  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transitions_).
  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transitions_).
  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var3 = &(this->output_values_)._M_t._M_impl.super__Rb_tree_header;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->output_ordering_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output_ordering_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output_ordering_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->next_state_fn_ln_)._M_h._M_buckets = &(this->next_state_fn_ln_)._M_h._M_single_bucket;
  (this->next_state_fn_ln_)._M_h._M_bucket_count = 1;
  (this->next_state_fn_ln_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->next_state_fn_ln_)._M_h._M_element_count = 0;
  (this->next_state_fn_ln_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->next_state_fn_ln_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->next_state_fn_ln_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->output_fn_ln_)._M_h._M_buckets = &(this->output_fn_ln_)._M_h._M_single_bucket;
  (this->output_fn_ln_)._M_h._M_bucket_count = 1;
  (this->output_fn_ln_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->output_fn_ln_)._M_h._M_element_count = 0;
  (this->output_fn_ln_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->output_fn_ln_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->output_fn_ln_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

FSMState::FSMState(std::string name, FSM* parent) : name_(std::move(name)), parent_(parent) {}